

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  byte bVar1;
  ParseInfoTree *this_00;
  Finder *pFVar2;
  bool bVar3;
  int iVar4;
  ParseInfoTree *pPVar5;
  undefined4 extraout_var;
  Message *pMVar6;
  string *psVar7;
  _Alloc_hider _Var8;
  string_view message_00;
  string delimiter;
  undefined1 local_120 [48];
  string local_f0;
  string local_d0;
  undefined1 local_b0 [40];
  char *local_88;
  char local_80 [32];
  undefined8 local_60;
  char *local_58;
  MessageFactory *factory;
  
  iVar4 = this->recursion_limit_;
  this->recursion_limit_ = iVar4 + -1;
  if (iVar4 < 1) {
    local_120._0_8_ = (pointer)0x4b;
    local_120._8_8_ = "Message is too deep, the parser exceeded the configured recursion limit of ";
    local_b0._32_8_ =
         absl::lts_20240722::numbers_internal::FastIntToBuffer
                   (this->initial_recursion_limit_,local_80);
    local_b0._32_8_ = local_b0._32_8_ - (long)local_80;
    local_60 = 1;
    local_58 = ".";
    local_88 = local_80;
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)local_b0,(AlphaNum *)local_120,(AlphaNum *)(local_b0 + 0x20));
    message_00._M_str = (char *)local_b0._0_8_;
    message_00._M_len = local_b0._8_8_;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message_00)
    ;
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    return false;
  }
  this_00 = this->parse_info_tree_;
  if (this_00 != (ParseInfoTree *)0x0) {
    pPVar5 = ParseInfoTree::CreateNested(this_00,field);
    this->parse_info_tree_ = pPVar5;
  }
  local_120._0_8_ = local_120 + 0x10;
  local_120._8_8_ = (char *)0x0;
  local_120[0x10] = '\0';
  bVar3 = ConsumeMessageDelimiter(this,(string *)local_120);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_003098cf;
  }
  pFVar2 = this->finder_;
  if (pFVar2 == (Finder *)0x0) {
    factory = (MessageFactory *)0x0;
  }
  else {
    iVar4 = (*pFVar2->_vptr_Finder[5])(pFVar2,field);
    factory = (MessageFactory *)CONCAT44(extraout_var,iVar4);
  }
  bVar1 = field->field_0x1;
  bVar3 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar3) {
    psVar7 = (string *)0x0;
  }
  else {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar3,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar7 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)(local_b0 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
               ,0xab7,*(undefined8 *)(psVar7 + 8),*(undefined8 *)psVar7);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)(local_b0 + 0x20));
  }
  if ((field->field_0x1 & 0x20) == 0) {
    pMVar6 = Reflection::MutableMessage(reflection,message,field,factory);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_120._0_8_,(char *)(local_120._8_8_ + local_120._0_8_));
    bVar3 = ConsumeMessage(this,pMVar6,&local_f0);
    local_d0.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var8._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_003098ad:
      operator_delete(_Var8._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pMVar6 = Reflection::AddMessage(reflection,message,field,factory);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_120._0_8_,(char *)(local_120._8_8_ + local_120._0_8_));
    bVar3 = ConsumeMessage(this,pMVar6,&local_d0);
    _Var8._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_003098ad;
  }
  bVar3 = bVar3 != false;
  if (bVar3) {
    this->recursion_limit_ = this->recursion_limit_ + 1;
    this->parse_info_tree_ = this_00;
  }
LAB_003098cf:
  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,CONCAT71(local_120._17_7_,local_120[0x10]) + 1);
  }
  return bVar3;
}

Assistant:

bool ConsumeFieldMessage(Message* message, const Reflection* reflection,
                           const FieldDescriptor* field) {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }
    // If the parse information tree is not nullptr, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != nullptr) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    MessageFactory* factory =
        finder_ ? finder_->FindExtensionFactory(field) : nullptr;
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field, factory),
                        delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field, factory),
                        delimiter));
    }

    ++recursion_limit_;

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }